

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O3

KBO * Kernel::KBO::testKBO(KBO *__return_storage_ptr__,bool rand,bool qkbo)

{
  undefined8 uVar1;
  undefined7 in_register_00000031;
  size_t in_R8;
  ulong uVar2;
  IterTraits<Lib::RangeIterator<int>_> it;
  IterTraits<Lib::RangeIterator<int>_> it_00;
  IterTraits<Lib::RangeIterator<int>_> it_01;
  DArray<int> out_2;
  DArray<int> out_1;
  DArray<int> out;
  DArray<int> local_70;
  KboWeightMap<Kernel::FuncSigTraits> local_58;
  
  if ((int)CONCAT71(in_register_00000031,rand) == 0) {
    KboWeightMap<Kernel::FuncSigTraits>::dflt(&local_58,qkbo);
  }
  else {
    KboWeightMap<Kernel::FuncSigTraits>::
    randomized<Kernel::KboWeightMap<Kernel::FuncSigTraits>::randomized(bool)::_lambda(unsigned_int,unsigned_int)_1_>
              (&local_58,(KboWeightMap<Kernel::FuncSigTraits> *)0x10000,qkbo);
  }
  uVar2 = (ulong)(*(long *)(DAT_00b521b0 + 0x68) - *(long *)(DAT_00b521b0 + 0x60)) >> 3;
  it._iter._0_8_ = uVar2 & 0xffffffff;
  it._iter._to = 0;
  Lib::DArray<int>::fromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
            (&out,(DArray<int> *)0x0,it,in_R8);
  if (rand) {
    Shell::Shuffling::shuffleArray<Lib::DArray<int>>(&out,(uint)uVar2);
  }
  uVar2 = (ulong)(*(long *)(DAT_00b521b0 + 0xa8) - *(long *)(DAT_00b521b0 + 0xa0)) >> 3;
  it_00._iter._0_8_ = uVar2 & 0xffffffff;
  it_00._iter._to = 0;
  Lib::DArray<int>::fromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
            (&out_1,(DArray<int> *)0x0,it_00,in_R8);
  if (rand) {
    Shell::Shuffling::shuffleArray<Lib::DArray<int>>(&out_1,(uint)uVar2);
  }
  uVar2 = (ulong)(*(long *)(DAT_00b521b0 + 0x88) - *(long *)(DAT_00b521b0 + 0x80)) >> 3;
  it_01._iter._0_8_ = uVar2 & 0xffffffff;
  it_01._iter._to = 0;
  Lib::DArray<int>::fromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
            (&out_2,(DArray<int> *)0x0,it_01,in_R8);
  if (rand) {
    Shell::Shuffling::shuffleArray<Lib::DArray<int>>(&out_2,(uint)uVar2);
  }
  PrecedenceOrdering::testLevels();
  KBO(__return_storage_ptr__,&local_58,&out,&out_1,&out_2,&local_70,false,qkbo);
  if (local_70._array != (int *)0x0) {
    uVar2 = local_70._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_70._array;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_70._array;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_70._array;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_70._array;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_70._array;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)local_70._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_70._array;
    }
    else {
      operator_delete(local_70._array,0x10);
    }
  }
  if (out_2._array != (int *)0x0) {
    uVar2 = out_2._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = out_2._array;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = out_2._array;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = out_2._array;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = out_2._array;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = out_2._array;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)out_2._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = out_2._array;
    }
    else {
      operator_delete(out_2._array,0x10);
    }
  }
  if (out_1._array != (int *)0x0) {
    uVar2 = out_1._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = out_1._array;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = out_1._array;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = out_1._array;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = out_1._array;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = out_1._array;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)out_1._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = out_1._array;
    }
    else {
      operator_delete(out_1._array,0x10);
    }
  }
  if (out._array != (int *)0x0) {
    uVar2 = out._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = out._array;
    }
    else if (uVar2 < 0x11) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = out._array;
    }
    else if (uVar2 < 0x19) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = out._array;
    }
    else if (uVar2 < 0x21) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = out._array;
    }
    else if (uVar2 < 0x31) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = out._array;
    }
    else if (uVar2 < 0x41) {
      *(undefined8 *)out._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = out._array;
    }
    else {
      operator_delete(out._array,0x10);
    }
  }
  if (local_58._weights._array != (uint *)0x0) {
    uVar1 = local_58._weights._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._weights._array;
    }
    else if ((ulong)uVar1 < 0x11) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._weights._array;
    }
    else if ((ulong)uVar1 < 0x19) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._weights._array;
    }
    else if ((ulong)uVar1 < 0x21) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._weights._array;
    }
    else if ((ulong)uVar1 < 0x31) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._weights._array;
    }
    else if ((ulong)uVar1 < 0x41) {
      *(undefined8 *)local_58._weights._array = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._weights._array;
    }
    else {
      operator_delete(local_58._weights._array,0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

KBO KBO::testKBO(bool rand, bool qkbo)
{
  auto predLevels = []() -> DArray<int>
    { return PrecedenceOrdering::testLevels(); };

  auto prec = [&](int size) {
    auto out = DArray<int>::fromIterator(range(0,size));
    if (rand) {
      Shuffling::shuffleArray(out, size);
    }
    return out;
  };
  return KBO(
      rand ? KboWeightMap<FuncSigTraits>::randomized(qkbo) : KboWeightMap<FuncSigTraits>::dflt(qkbo),
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
      rand ? KboWeightMap<PredSigTraits>::randomized(qkbo) : KboWeightMap<PredSigTraits>::dflt(qkbo),
#endif
      prec(env.signature->functions()),
      prec(env.signature->typeCons()),
      prec(env.signature->predicates()),
      predLevels(),
      /*reverseLCM=*/false,
      qkbo);
}